

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O1

int __thiscall ON_Displacement::FindSubItemArrayIndex(ON_Displacement *this,int face_index)

{
  int iVar1;
  CImplDSP *pCVar2;
  long lVar3;
  
  pCVar2 = this->m_impl_dsp;
  if (0 < (pCVar2->m_subs).m_count) {
    lVar3 = 0;
    do {
      iVar1 = SubItem::FaceIndex((pCVar2->m_subs).m_a[lVar3]);
      if (iVar1 == face_index) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
      pCVar2 = this->m_impl_dsp;
    } while (lVar3 < (pCVar2->m_subs).m_count);
  }
  return -1;
}

Assistant:

int ON_Displacement::FindSubItemArrayIndex(int face_index) const
{
  for (int i = 0; i < m_impl_dsp->m_subs.Count(); i++)
  {
    const auto* sub = m_impl_dsp->m_subs[i];
    if (sub->FaceIndex() == face_index)
      return i;
  }

  return -1;
}